

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentEntitySystem.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::SilentEntitySystem::Decode(SilentEntitySystem *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  EntityAppearance local_60;
  ushort local_50;
  undefined1 local_4d;
  KUINT16 i;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  SilentEntitySystem *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0xc) {
    local_4d = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    local_4d = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
  ::clear(&this->m_vEA);
  pKVar2 = KDataStream::operator>>(local_18,&this->m_ui16NumEnts);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16NumOfAppearanceRecords);
  operator>>(pKVar2,&(this->m_EntTyp).super_DataTypeBase);
  for (local_50 = 0; local_50 < this->m_ui16NumOfAppearanceRecords; local_50 = local_50 + 1) {
    DATA_TYPE::EntityAppearance::EntityAppearance(&local_60,local_18);
    std::
    vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>::
    push_back(&this->m_vEA,&local_60);
    DATA_TYPE::EntityAppearance::~EntityAppearance(&local_60);
  }
  return;
}

Assistant:

void SilentEntitySystem::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < SILENT_ENTITY_SYSTEM_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vEA.clear();

    stream >> m_ui16NumEnts
           >> m_ui16NumOfAppearanceRecords
           >> KDIS_STREAM m_EntTyp;

    for( KUINT16 i = 0; i < m_ui16NumOfAppearanceRecords; ++i )
    {
        m_vEA.push_back( EntityAppearance( stream ) );
    }
}